

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

bool __thiscall imrt::Station::canReduceIntensity(Station *this,int beam)

{
  int iVar1;
  bool bVar2;
  int i;
  long lVar3;
  
  for (lVar3 = 0; iVar1 = this->max_apertures, lVar3 < iVar1; lVar3 = lVar3 + 1) {
    bVar2 = isOpenBeamlet(this,beam,(int)lVar3);
    if ((bVar2) &&
       (0.0 < (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3])) break;
  }
  return lVar3 < iVar1;
}

Assistant:

bool Station::canReduceIntensity(int beam){
    for (int i =0;i<max_apertures;i++)
      if (isOpenBeamlet(beam,i) && intensity[i]>0) return(true);
    return(false);
  }